

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler>
::write_char(arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::internal::error_handler> *this
            ,char_type value)

{
  size_t in_RCX;
  void *in_RDX;
  char in_SIL;
  basic_writer<fmt::v6::buffer_range<char>_> *in_RDI;
  char_writer *in_stack_00000040;
  format_specs *in_stack_00000048;
  basic_writer<fmt::v6::buffer_range<char>_> *in_stack_00000050;
  
  if (in_RDI[1].out_.container == (buffer<char> *)0x0) {
    basic_writer<fmt::v6::buffer_range<char>_>::write(in_RDI,(int)in_SIL,in_RDX,in_RCX);
  }
  else {
    basic_writer<fmt::v6::buffer_range<char>>::
    write_padded<fmt::v6::internal::arg_formatter_base<fmt::v6::buffer_range<char>,fmt::v6::internal::error_handler>::char_writer>
              (in_stack_00000050,in_stack_00000048,in_stack_00000040);
  }
  return;
}

Assistant:

void write_char(char_type value) {
    if (specs_)
      writer_.write_padded(*specs_, char_writer{value});
    else
      writer_.write(value);
  }